

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

int Curl_hash_delete(Curl_hash *h,void *key,size_t key_len)

{
  Curl_hash_element **ppCVar1;
  Curl_hash_element *he;
  size_t sVar2;
  Curl_hash_element *pCVar3;
  
  ppCVar1 = h->table;
  if (ppCVar1 != (Curl_hash_element **)0x0) {
    sVar2 = (*h->hash_func)(key,key_len,h->slots);
    he = (Curl_hash_element *)(ppCVar1 + sVar2);
    do {
      pCVar3 = he;
      he = pCVar3->next;
      if (he == (Curl_hash_element *)0x0) {
        return 1;
      }
      sVar2 = (*h->comp_func)(he->key,he->key_len,key,key_len);
    } while (sVar2 == 0);
    pCVar3->next = he->next;
    h->size = h->size - 1;
    hash_elem_destroy(h,he);
    if (he != (Curl_hash_element *)0x0) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int Curl_hash_delete(struct Curl_hash *h, void *key, size_t key_len)
{
  DEBUGASSERT(h);
  DEBUGASSERT(h->slots);
  DEBUGASSERT(h->init == HASHINIT);
  if(h->table) {
    struct Curl_hash_element *he, **he_anchor;

    he_anchor = CURL_HASH_SLOT_ADDR(h, key, key_len);
    while(*he_anchor) {
      he = *he_anchor;
      if(h->comp_func(he->key, he->key_len, key, key_len)) {
        hash_elem_unlink(h, he_anchor, he);
        hash_elem_destroy(h, he);
        return 0;
      }
      he_anchor = &he->next;
    }
  }
  return 1;
}